

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::RegisterTests
          (ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest> *this)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ulong uVar4;
  TestInfo *pTVar5;
  char *pcVar6;
  undefined4 extraout_var;
  SetUpTestCaseFunc in_RDI;
  char *in_stack_00000018;
  Message test_name_stream;
  iterator param_it;
  int i;
  string test_case_name;
  ParamGenerator<char> generator;
  string *instantiation_name;
  iterator gen_it;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
  test_info;
  iterator test_it;
  code *in_stack_fffffffffffffe68;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
  *in_stack_fffffffffffffe70;
  ParamGenerator<char> *in_stack_fffffffffffffe78;
  TestMetaFactoryBase<char> *in_stack_fffffffffffffe90;
  TestInfo *in_stack_fffffffffffffe98;
  Message *in_stack_fffffffffffffea0;
  TypeId in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  TearDownTestCaseFunc in_stack_ffffffffffffff30;
  TestFactoryBase *in_stack_ffffffffffffff38;
  string local_a0 [32];
  string local_80 [48];
  undefined1 local_50 [16];
  pointer local_40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>
  *local_38;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>_>
  local_30;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
  local_28;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
  *local_18;
  __normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>_>
  local_10 [2];
  
  local_10[0]._M_current =
       (linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
        *)std::
          vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>
          ::begin((vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>
                   *)in_stack_fffffffffffffe68);
  while( true ) {
    local_18 = (linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
                *)std::
                  vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>
                  ::end((vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>
                         *)in_stack_fffffffffffffe68);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffe70,
                       (__normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>_>
    ::operator*(local_10);
    linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
    ::linked_ptr(in_stack_fffffffffffffe70,
                 (linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
                  *)in_stack_fffffffffffffe68);
    local_30._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>
                     *)in_stack_fffffffffffffe68);
    while( true ) {
      local_38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>
                  *)std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>
                    ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>
                           *)in_stack_fffffffffffffe68);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>_>
                          *)in_stack_fffffffffffffe70,
                         (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>_>
                          *)in_stack_fffffffffffffe68);
      if (!bVar1) break;
      local_40 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>_>
                 ::operator->(&local_30);
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>_>
               ::operator->(&local_30);
      (*ppVar3->second)(local_50);
      std::__cxx11::string::string(local_80);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::operator+(&in_stack_fffffffffffffe98->test_case_base_name,
                       (char *)in_stack_fffffffffffffe90);
        std::__cxx11::string::operator=(local_80,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
      pTVar5 = linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
               ::operator->(&local_28);
      std::__cxx11::string::operator+=(local_80,(string *)pTVar5);
      ParamGenerator<char>::begin(in_stack_fffffffffffffe78);
      while( true ) {
        ParamGenerator<char>::end(in_stack_fffffffffffffe78);
        bVar1 = ParamIterator<char>::operator!=
                          ((ParamIterator<char> *)in_stack_fffffffffffffe70,
                           (ParamIterator<char> *)in_stack_fffffffffffffe68);
        ParamIterator<char>::~ParamIterator((ParamIterator<char> *)0x119331);
        if (!bVar1) break;
        Message::Message(in_stack_fffffffffffffea0);
        linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
        ::operator->(&local_28);
        Message::operator<<((Message *)in_stack_fffffffffffffe70,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe68);
        Message::operator<<((Message *)in_stack_fffffffffffffe70,
                            (char (*) [2])in_stack_fffffffffffffe68);
        Message::operator<<((Message *)in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68);
        std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffe78);
        std::__cxx11::string::c_str();
        ParamIterator<char>::operator*((ParamIterator<char> *)0x11943e);
        PrintToString<char>(in_stack_00000018);
        in_stack_fffffffffffffea0 = (Message *)std::__cxx11::string::c_str();
        (**(code **)(*(long *)in_RDI + 0x18))();
        in_stack_fffffffffffffe98 =
             linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
             ::operator->(&local_28);
        in_stack_fffffffffffffe90 =
             scoped_ptr<testing::internal::TestMetaFactoryBase<char>_>::operator->
                       (&in_stack_fffffffffffffe98->test_meta_factory);
        pcVar6 = ParamIterator<char>::operator*((ParamIterator<char> *)0x1194b9);
        iVar2 = (*in_stack_fffffffffffffe90->_vptr_TestMetaFactoryBase[2])
                          (in_stack_fffffffffffffe90,(ulong)(uint)(int)*pcVar6);
        in_stack_fffffffffffffe70 =
             (linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
              *)CONCAT44(extraout_var,iVar2);
        in_stack_fffffffffffffe68 = Test::TearDownTestCase;
        MakeAndRegisterTestInfo
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_RDI,
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
        Message::~Message((Message *)0x119540);
        ParamIterator<char>::operator++((ParamIterator<char> *)in_stack_fffffffffffffe70);
      }
      ParamIterator<char>::~ParamIterator((ParamIterator<char> *)0x119346);
      std::__cxx11::string::~string(local_80);
      ParamGenerator<char>::~ParamGenerator((ParamGenerator<char> *)0x1195f5);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::ParamGenerator<char>_(*)()>_>_>_>
      ::operator++(&local_30);
    }
    linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
    ::~linked_ptr((linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
                   *)0x119630);
    __gnu_cxx::
    __normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>_>_>_>
    ::operator++(local_10);
  }
  return;
}

Assistant:

virtual void RegisterTests() {
    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      linked_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin(); gen_it != instantiations_.end();
               ++gen_it) {
        const string& instantiation_name = gen_it->first;
        ParamGenerator<ParamType> generator((*gen_it->second)());

        string test_case_name;
        if ( !instantiation_name.empty() )
          test_case_name = instantiation_name + "/";
        test_case_name += test_info->test_case_base_name;

        int i = 0;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          Message test_name_stream;
          test_name_stream << test_info->test_base_name << "/" << i;
          MakeAndRegisterTestInfo(
              test_case_name.c_str(),
              test_name_stream.GetString().c_str(),
              NULL,  // No type parameter.
              PrintToString(*param_it).c_str(),
              GetTestCaseTypeId(),
              TestCase::SetUpTestCase,
              TestCase::TearDownTestCase,
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }  // for gen_it
    }  // for test_it
  }